

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.hpp
# Opt level: O3

void __thiscall
jsoncons::basic_json_parser<char,_std::allocator<char>_>::~basic_json_parser
          (basic_json_parser<char,_std::allocator<char>_> *this)

{
  ~basic_json_parser(this);
  operator_delete(this,0xf8);
  return;
}

Assistant:

~basic_json_parser() noexcept
    {
    }